

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# dfsbfs.cpp
# Opt level: O1

void dfs(int u)

{
  ulong *puVar1;
  int *piVar2;
  ulong uVar3;
  ulong uVar4;
  int in_EDI;
  int *piVar5;
  int local_24;
  
  uVar4 = (ulong)in_EDI;
  uVar3 = uVar4 + 0x3f;
  if (-1 < (long)uVar4) {
    uVar3 = uVar4;
  }
  puVar1 = (ulong *)(((long)uVar3 >> 6) * 8 + (anonymous_namespace)::useddfs + -8 +
                    (ulong)((uVar4 & 0x800000000000003f) < 0x8000000000000001) * 8);
  *puVar1 = *puVar1 | 1L << ((byte)in_EDI & 0x3f);
  local_24 = in_EDI;
  if (DAT_001193c0._M_current == _DAT_001193c8) {
    std::vector<int,std::allocator<int>>::_M_realloc_insert<int_const&>
              ((vector<int,std::allocator<int>> *)&(anonymous_namespace)::comp,DAT_001193c0,
               &local_24);
  }
  else {
    *DAT_001193c0._M_current = in_EDI;
    DAT_001193c0._M_current = DAT_001193c0._M_current + 1;
  }
  piVar2 = edge.
           super__Vector_base<std::vector<int,_std::allocator<int>_>,_std::allocator<std::vector<int,_std::allocator<int>_>_>_>
           ._M_impl.super__Vector_impl_data._M_start[local_24].
           super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data._M_finish;
  for (piVar5 = edge.
                super__Vector_base<std::vector<int,_std::allocator<int>_>,_std::allocator<std::vector<int,_std::allocator<int>_>_>_>
                ._M_impl.super__Vector_impl_data._M_start[local_24].
                super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
                _M_start; piVar5 != piVar2; piVar5 = piVar5 + 1) {
    uVar4 = (ulong)*piVar5;
    uVar3 = uVar4 + 0x3f;
    if (-1 < (long)uVar4) {
      uVar3 = uVar4;
    }
    if ((*(ulong *)(((long)uVar3 >> 6) * 8 + (anonymous_namespace)::useddfs + -8 +
                   (ulong)((uVar4 & 0x800000000000003f) < 0x8000000000000001) * 8) >> (uVar4 & 0x3f)
        & 1) == 0) {
      dfs(0);
    }
  }
  return;
}

Assistant:

void dfs(int u) {
    useddfs[u] = true;
    comp.push_back(u);
    for (int i : edge[u])
        if (!useddfs[i])
            dfs(i);
}